

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3SafetyCheckSickOrOk(sqlite3 *db)

{
  u8 uVar1;
  int iVar2;
  
  uVar1 = db->eOpenState;
  iVar2 = 1;
  if (((uVar1 != 'm') && (uVar1 != 'v')) && (uVar1 != 0xba)) {
    iVar2 = 0;
    sqlite3_log(0x15,"API call with %s database connection pointer","invalid");
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3SafetyCheckSickOrOk(sqlite3 *db){
  u8 eOpenState;
  eOpenState = db->eOpenState;
  if( eOpenState!=SQLITE_STATE_SICK &&
      eOpenState!=SQLITE_STATE_OPEN &&
      eOpenState!=SQLITE_STATE_BUSY ){
    testcase( sqlite3GlobalConfig.xLog!=0 );
    logBadConnection("invalid");
    return 0;
  }else{
    return 1;
  }
}